

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O1

int __thiscall gdsForge::GDSwriteRec(gdsForge *this,int record)

{
  bool bVar1;
  uchar OHout [4];
  undefined2 local_c;
  undefined1 local_a;
  char local_9;
  
  local_c = 0x400;
  local_a = (undefined1)((uint)record >> 8);
  local_9 = (char)record;
  bVar1 = local_9 == '\0';
  if (bVar1) {
    fwrite(&local_c,1,4,(FILE *)this->gdsFile);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The smoke has escaped. The record must be dataless",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
  }
  return (uint)!bVar1;
}

Assistant:

int gdsForge::GDSwriteRec(int record)
{
  unsigned char OHout[4];

  OHout[0] = 0;
  OHout[1] = 4;
  OHout[2] = record >> 8 & 0xff;
  OHout[3] = record & 0xff;

  if (OHout[3] != 0) {
    cout << "The smoke has escaped. The record must be dataless" << endl;
    return 1;
  }

  fwrite(OHout, 1, 4, this->gdsFile);

  return 0;
}